

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

void __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::Replace
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,size_t pos,size_t posNew)

{
  _List_node_base *p_Var1;
  
  if (pos == posNew) {
    return;
  }
  for (p_Var1 = (this->
                super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                ).
                super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)this;
      p_Var1 = (((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)&p_Var1->_M_next)->
               super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next) {
    MP<136UL,_GF2::MOGrevlex<136UL>_>::Replace
              ((MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var1 + 1),pos,posNew);
  }
  Normalize(this);
  return;
}

Assistant:

void Replace(size_t pos, size_t posNew)
	{	
		if (pos == posNew) return;
		for (iterator iter = begin(); iter != end(); ++iter)
			iter->Replace(pos, posNew);
		Normalize();
	}